

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O1

string * __thiscall
RenX_Ladder_WebPlugin::generate_profile_page_abi_cxx11_
          (RenX_Ladder_WebPlugin *this,LadderDatabase *db,uint8_t format,uint64_t steam_id,
          query_table_type *query_params)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long lVar4;
  Entry *pEVar5;
  size_type __n;
  char *__s;
  undefined1 auVar6 [16];
  string profile_data;
  string local_78;
  undefined8 local_58;
  string local_50;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (this_00->_M_dataplus)._M_p = (pointer)&this_00->field_2;
  this_00->_M_string_length = 0;
  (this_00->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (this_00,0x800);
  if ((this->FLAG_INCLUDE_PAGE_HEADER & format) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (this_00,(this->header)._M_dataplus._M_p,(this->header)._M_string_length);
  }
  if ((this->FLAG_INCLUDE_SEARCH & format) != 0) {
    generate_search_abi_cxx11_(&local_78,db);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (this_00,local_78._M_dataplus._M_p,local_78._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->FLAG_INCLUDE_SELECTOR & format) != 0) {
    generate_database_selector_abi_cxx11_(&local_78,db,query_params);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (this_00,local_78._M_dataplus._M_p,local_78._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  lVar4 = RenX::LadderDatabase::getEntries();
  if (lVar4 == 0) {
    __s = "Error: No ladder data";
    __n = 0x15;
  }
  else {
    for (pEVar5 = (Entry *)RenX::LadderDatabase::getHead(); pEVar5 != (Entry *)0x0;
        pEVar5 = pEVar5->next) {
      if (pEVar5->steam_id == steam_id) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        pcVar1 = (this->entry_profile)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar1,pcVar1 + (this->entry_profile)._M_string_length);
        RenX::processTags((string *)&local_78,pEVar5);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (this_00,local_78._M_dataplus._M_p,local_78._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (this_00,"<div class=\"profile-navigation\">",0x20);
        if (pEVar5->prev != (Entry *)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_78,&this->entry_profile_previous);
          local_58 = *(undefined8 *)(RenX::tags + 0x14e8);
          uVar2 = *(undefined8 *)(RenX::tags + 0x14f0);
          auVar6 = RenX::LadderDatabase::getName();
          RenX::replace_tag(&local_78,uVar2,local_58,auVar6._0_8_,auVar6._8_8_);
          uVar2 = *(undefined8 *)(RenX::tags + 0x14c8);
          uVar3 = *(undefined8 *)(RenX::tags + 0x14d0);
          string_printf_abi_cxx11_(&local_50,"%llu",pEVar5->prev->steam_id);
          RenX::replace_tag(&local_78,uVar3,uVar2,local_50._M_string_length,
                            local_50._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          RenX::processTags((string *)&local_78,pEVar5->prev);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (this_00,local_78._M_dataplus._M_p,local_78._M_string_length);
        }
        if (pEVar5->next != (Entry *)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_78,&this->entry_profile_next);
          local_58 = *(undefined8 *)(RenX::tags + 0x14e8);
          uVar2 = *(undefined8 *)(RenX::tags + 0x14f0);
          auVar6 = RenX::LadderDatabase::getName();
          RenX::replace_tag(&local_78,uVar2,local_58,auVar6._0_8_,auVar6._8_8_);
          uVar2 = *(undefined8 *)(RenX::tags + 0x908);
          uVar3 = *(undefined8 *)(RenX::tags + 0x910);
          string_printf_abi_cxx11_(&local_50,"%llu",pEVar5->next->steam_id);
          RenX::replace_tag(&local_78,uVar3,uVar2,local_50._M_string_length,
                            local_50._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          RenX::processTags((string *)&local_78,pEVar5->next);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (this_00,local_78._M_dataplus._M_p,local_78._M_string_length);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (this_00,"</div>",6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0010cc08;
      }
    }
    __s = "Error: Player not found";
    __n = 0x17;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this_00,__s,__n);
LAB_0010cc08:
  if ((this->FLAG_INCLUDE_PAGE_FOOTER & format) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (this_00,(this->footer)._M_dataplus._M_p,(this->footer)._M_string_length);
  }
  return this_00;
}

Assistant:

std::string* RenX_Ladder_WebPlugin::generate_profile_page(RenX::LadderDatabase *db, uint8_t format, uint64_t steam_id, const query_table_type& query_params) {
	std::string* result = new std::string();
	result->reserve(2048);

	if ((format & this->FLAG_INCLUDE_PAGE_HEADER) != 0)
		result->append(RenX_Ladder_WebPlugin::header);

	if ((format & this->FLAG_INCLUDE_SEARCH) != 0) // Search
		result->append(generate_search(db));

	if ((format & this->FLAG_INCLUDE_SELECTOR) != 0) // Selector
		result->append(generate_database_selector(db, query_params));

	if (db->getEntries() == 0) { // No ladder data
		result->append("Error: No ladder data"sv);

		if ((format & this->FLAG_INCLUDE_PAGE_FOOTER) != 0) // Footer
			result->append(RenX_Ladder_WebPlugin::footer);

		return result;
	}

	RenX::LadderDatabase::Entry *entry = db->getHead();
	while (entry != nullptr) {
		if (entry->steam_id == steam_id) // match found
			break;
		entry = entry->next;
	}

	if (entry == nullptr) {
		result->append("Error: Player not found"sv);
	}
	else {
		std::string profile_data(RenX_Ladder_WebPlugin::entry_profile);
		RenX::processTags(profile_data, *entry);
		result->append(profile_data);

		result->append("<div class=\"profile-navigation\">"sv);
		if (entry->prev != nullptr)
		{
			profile_data = RenX_Ladder_WebPlugin::entry_profile_previous;
			RenX::replace_tag(profile_data, RenX::tags->INTERNAL_OBJECT_TAG, db->getName());
			RenX::replace_tag(profile_data, RenX::tags->INTERNAL_WEAPON_TAG, string_printf("%llu", entry->prev->steam_id));
			RenX::processTags(profile_data, *entry->prev);
			result->append(profile_data);
		}
		if (entry->next != nullptr)
		{
			profile_data = RenX_Ladder_WebPlugin::entry_profile_next;
			RenX::replace_tag(profile_data, RenX::tags->INTERNAL_OBJECT_TAG, db->getName());
			RenX::replace_tag(profile_data, RenX::tags->INTERNAL_VICTIM_STEAM_TAG, string_printf("%llu", entry->next->steam_id));
			RenX::processTags(profile_data, *entry->next);
			result->append(profile_data);
		}
		result->append("</div>"sv);
	}

	if ((format & this->FLAG_INCLUDE_PAGE_FOOTER) != 0) // Footer
		result->append(RenX_Ladder_WebPlugin::footer);

	return result;
}